

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O2

void EVPinit(CManager_conflict cm)

{
  FILE *__stream;
  uint uVar1;
  int iVar2;
  __pid_t _Var3;
  int iVar4;
  _event_path_data *p_Var5;
  FMContext p_Var6;
  time_t tVar7;
  pthread_t pVar8;
  char *__nptr;
  timespec ts;
  
  p_Var5 = (_event_path_data *)INT_CMmalloc(0xd0);
  cm->evp = p_Var5;
  memset(p_Var5,0,0xd0);
  cm->evp->ffsc = cm->FFScontext;
  p_Var6 = (FMContext)FMContext_from_FFS();
  p_Var5 = cm->evp;
  p_Var5->fmc = p_Var6;
  p_Var5->stone_base_num = 0;
  if (EVPinit_first_evpinit == '\x01') {
    tVar7 = time((time_t *)0x0);
    srand((uint)tVar7);
    uVar1 = cm->evp->stone_base_num;
    while (uVar1 == 0) {
      uVar1 = rand();
      uVar1 = uVar1 & 0xffff;
      cm->evp->stone_base_num = uVar1;
    }
  }
  iVar2 = CMtrace_val[10];
  if (cm->CMTrace_file == (FILE *)0x0) {
    iVar2 = CMtrace_init(cm,EVerbose);
  }
  if (iVar2 != 0) {
    if (CMtrace_PID != 0) {
      __stream = (FILE *)cm->CMTrace_file;
      _Var3 = getpid();
      pVar8 = pthread_self();
      fprintf(__stream,"P%lxT%lx - ",(long)_Var3,pVar8);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fprintf((FILE *)cm->CMTrace_file,"INITATED EVPATH, base stone num is %x\n",
            (ulong)(uint)cm->evp->stone_base_num);
  }
  fflush((FILE *)cm->CMTrace_file);
  EVPinit_first_evpinit = 1;
  p_Var5 = cm->evp;
  p_Var5->queue_items_free_list = (queue_item *)0x0;
  iVar2 = 0;
  pthread_mutex_init((pthread_mutex_t *)&p_Var5->lock,(pthread_mutexattr_t *)0x0);
  internal_add_shutdown_task(cm,free_evp,(void *)0x0,2);
  __nptr = getenv("EVBackpressure");
  if ((__nptr != (char *)0x0) && (iVar4 = atoi(__nptr), iVar4 != 0)) {
    iVar2 = 1;
  }
  cm->evp->use_backpressure = iVar2;
  INT_CMadd_poll(cm,deferred_process_actions,(void *)0x0);
  REVPinit(cm);
  return;
}

Assistant:

void
EVPinit(CManager cm)
{
    static int first_evpinit = 1;
    cm->evp = INT_CMmalloc(sizeof( struct _event_path_data));
    memset(cm->evp, 0, sizeof( struct _event_path_data));
    cm->evp->ffsc = cm->FFScontext;
    cm->evp->fmc = FMContext_from_FFS(cm->evp->ffsc);
    cm->evp->stone_base_num = 0;
    if (!first_evpinit) {
	/* 
	 * after the first evpinit, start stones at random base number,
	 * just so that we're more likely to catch mitmatched stone/CM
	 * combos in threaded situations.
	*/
	srand((int)time(NULL));
	while (cm->evp->stone_base_num == 0) {
	    cm->evp->stone_base_num = rand() & 0xffff;
	}
    }
    CMtrace_out(cm, EVerbose, "INITATED EVPATH, base stone num is %x\n", 
		cm->evp->stone_base_num);
    first_evpinit = 0;
    cm->evp->queue_items_free_list = NULL;
    thr_mutex_init(cm->evp->lock);
    internal_add_shutdown_task(cm, free_evp, NULL, FREE_TASK);
    {
        char *backpressure_env;
        backpressure_env = getenv("EVBackpressure");
        if (backpressure_env && atoi(backpressure_env) != 0) {
            cm->evp->use_backpressure = 1;
        } else {
            cm->evp->use_backpressure = 0;
        }
    }
    INT_CMadd_poll(cm, deferred_process_actions, NULL);
    REVPinit(cm);
}